

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_BLX_i(DisasContext_conflict1 *s,arg_BLX_i *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uintptr_t o;
  TCGv_i32 pTVar2;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((s->thumb == 0) || ((a->imm & 2) == 0)) {
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_R[0xe] + (long)tcg_ctx),
                        (long)(int)(s->thumb | (uint)(s->base).pc_next));
    pTVar2 = tcg_const_i32_aarch64(tcg_ctx,(uint)(s->thumb == 0));
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar2 + (long)tcg_ctx),
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x220);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
    if (((s->base).singlestep_enabled == false) && (s->ss_active != true)) {
      gen_goto_tb(s,0,(ulong)(((int)s->pc_curr + (uint)(s->thumb == 0) * 4 + 4 & 0xfffffffc) +
                             a->imm));
    }
    else {
      trans_BLX_i_cold_1();
    }
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool trans_BLX_i(DisasContext *s, arg_BLX_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    /* For A32, ARCH(5) is checked near the start of the uncond block. */
    if (s->thumb && (a->imm & 2)) {
        return false;
    }
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    tmp = tcg_const_i32(tcg_ctx, !s->thumb);
    store_cpu_field(tcg_ctx, tmp, thumb);
    gen_jmp(s, (read_pc(s) & ~3) + a->imm);
    return true;
}